

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O1

void spell_horde_communion(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CClass *pCVar3;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  bVar1 = is_npc(ch);
  if ((bVar1) && ((ch->desc == (DESCRIPTOR_DATA *)0x0 || (ch->desc->original == (CHAR_DATA *)0x0))))
  {
    return;
  }
  bVar1 = is_npc(ch);
  if (bVar1) {
    ch = ch->desc->original;
  }
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_horde_communion);
  if (bVar1) {
    txt = "They cannot try the communion ritual again right now.\n\r";
  }
  else if (ch == (CHAR_DATA *)vo) {
    txt = "You have already undergone the sacred communion!\n\r";
  }
  else if (((ch->cabal == 3) && (ch->pcdata->induct == 5)) || (bVar1 = is_immortal(ch), bVar1)) {
    bVar1 = is_npc((CHAR_DATA *)vo);
    if (bVar1) {
      txt = "You profane the spirits with such notions.\n\r";
    }
    else {
      if (*(short *)((long)vo + 0x132) == 0) {
        if ((0xe < *(short *)((long)vo + 0x138)) && (bVar1 = is_lawful((CHAR_DATA *)vo), !bVar1)) {
          pCVar3 = char_data::Class((char_data *)vo);
          bVar1 = RString::operator==(&pCVar3->name,"sorcerer");
          if (!bVar1) {
            pCVar3 = char_data::Class((char_data *)vo);
            bVar1 = RString::operator==(&pCVar3->name,"paladin");
            if (!bVar1) {
              pCVar3 = char_data::Class((char_data *)vo);
              bVar1 = RString::operator==(&pCVar3->name,"necromancer");
              if (!bVar1) {
                pCVar3 = char_data::Class((char_data *)vo);
                bVar1 = RString::operator==(&pCVar3->name,"healer");
                if (!bVar1) {
                  pCVar3 = char_data::Class((char_data *)vo);
                  bVar1 = RString::operator==(&pCVar3->name,"shapeshifter");
                  if (!bVar1) {
                    pCVar3 = char_data::Class((char_data *)vo);
                    bVar1 = RString::operator==(&pCVar3->name,"chronomancer");
                    if (!bVar1) {
                      if ((cabal_members[3] < cabal_max[3]) || (iVar2 = get_trust(ch), 0x35 < iVar2)
                         ) {
                        act("You prepare $N for communion with the animal spirits of Horde.",ch,
                            (void *)0x0,vo,3);
                        act("A tranquil calm washes over you as your skin tingles slightly.",ch,
                            (void *)0x0,vo,2);
                        act("A gentle breeze sweeps through, as an eerie silence falls over the area."
                            ,ch,(void *)0x0,vo,1);
                        init_affect(&AStack_98);
                        AStack_98.where = 0;
                        AStack_98.aftype = 2;
                        AStack_98.type = gsn_horde_communion;
                        AStack_98.modifier = 0;
                        AStack_98.duration = -1;
                        AStack_98.location = 0;
                        AStack_98.tick_fun = communion_tick;
                        AStack_98.owner = ch;
                        AStack_98.level = (short)level;
                        new_affect_to_char((CHAR_DATA *)vo,&AStack_98);
                        AStack_98.duration = 0x18;
                        AStack_98.tick_fun = (AFF_FUN *)0x0;
                        new_affect_to_char(ch,&AStack_98);
                        return;
                      }
                      txt = "The Horde is as large as it can possibly be.\n\r";
                      goto LAB_002d29f3;
                    }
                  }
                }
              }
            }
          }
        }
        act("$N is not fit to partake in the rites of communion.",ch,(void *)0x0,vo,3);
        return;
      }
      if (*(short *)((long)vo + 0x132) == 3) {
        txt = "The spirits will only answer the call once in each person\'s lifetime.\n\r";
      }
      else {
        txt = "That one has other allegiances already!";
      }
    }
  }
  else {
    txt = "It is not your place to call upon the spirits thus!\n\r";
  }
LAB_002d29f3:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_horde_communion(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_npc(ch) && (!ch->desc || !ch->desc->original))
		return;

	if (is_npc(ch))
		ch = ch->desc->original;

	if (is_affected(victim, gsn_horde_communion))
	{
		return send_to_char("They cannot try the communion ritual again right now.\n\r", ch);
	}

	if (ch == victim)
	{
		send_to_char("You have already undergone the sacred communion!\n\r", ch);
		return;
	}

	if ((ch->cabal != CABAL_HORDE || ch->pcdata->induct != CABAL_LEADER) && !is_immortal(ch))
	{
		send_to_char("It is not your place to call upon the spirits thus!\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("You profane the spirits with such notions.\n\r", ch);
		return;
	}

	if (victim->cabal == CABAL_HORDE)
	{
		send_to_char("The spirits will only answer the call once in each person's lifetime.\n\r", ch);
		return;
	}

	if (victim->cabal != CABAL_NONE)
	{
		send_to_char("That one has other allegiances already!", ch);
		return;
	}

	if (victim->level < 15
		|| is_lawful(victim)
		|| victim->Class()->name == "sorcerer"
		|| victim->Class()->name == "paladin"
		|| victim->Class()->name == "necromancer"
		|| victim->Class()->name == "healer"
		|| victim->Class()->name == "shapeshifter"
		|| victim->Class()->name == "chronomancer")
	{
		act("$N is not fit to partake in the rites of communion.", ch, 0, victim, TO_CHAR);
		return;
	}

	if (cabal_table[CABAL_HORDE].max_members > 1
		&& cabal_max[CABAL_HORDE] <= cabal_members[CABAL_HORDE]
		&& get_trust(ch) < 54)
	{
		send_to_char("The Horde is as large as it can possibly be.\n\r", ch);
		return;
	}

	act("You prepare $N for communion with the animal spirits of Horde.", ch, 0, victim, TO_CHAR);
	act("A tranquil calm washes over you as your skin tingles slightly.", ch, 0, victim, TO_VICT);
	act("A gentle breeze sweeps through, as an eerie silence falls over the area.", ch, 0, victim, TO_NOTVICT);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = gsn_horde_communion;
	af.location = 0;
	af.modifier = 0;
	af.duration = -1;
	af.owner = ch;
	af.level = level;
	af.tick_fun = communion_tick;
	new_affect_to_char(victim, &af);

	af.duration = 24;
	af.tick_fun = nullptr;
	new_affect_to_char(ch, &af);
}